

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOut.c
# Opt level: O3

int Gia_ManGlaRefine(Gia_Man_t *p,Abc_Cex_t *pCex,int fMinCut,int fVerbose)

{
  ulong *puVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  int *piVar5;
  int *piVar6;
  int iVar7;
  Gia_Man_t *pGVar8;
  Gia_Man_t *p_00;
  Abc_Cex_t *pAVar9;
  int iVar10;
  Vec_Int_t *pVVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  Gia_Obj_t *pGVar20;
  long lVar21;
  Gia_Man_t *pGVar22;
  bool bVar23;
  Vec_Int_t *vPis;
  Vec_Int_t *vPPis;
  timespec ts;
  Vec_Int_t *local_68;
  int local_5c;
  long local_58;
  Abc_Cex_t *local_50;
  Vec_Int_t *local_48;
  timespec local_40;
  
  iVar10 = 3;
  iVar7 = clock_gettime(3,&local_40);
  if (iVar7 < 0) {
    local_58 = 1;
  }
  else {
    lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    local_58 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  if (p->vGateClasses == (Vec_Int_t *)0x0) {
    Abc_Print(iVar10,"Gia_ManGlaRefine(): Abstraction gate map is missing.\n");
    return -1;
  }
  pGVar8 = Gia_ManDupAbsGates(p,p->vGateClasses);
  Gia_ManStop(pGVar8);
  pGVar8 = p;
  p_00 = Gia_ManDupAbsGates(p,p->vGateClasses);
  if (p_00->vCis->nSize - p_00->nRegs != pCex->nPis) {
    Abc_Print((int)pGVar8,"Gia_ManGlaRefine(): The PI counts in GLA and in CEX do not match.\n");
    Gia_ManStop(p_00);
    return -1;
  }
  pGVar8 = p_00;
  local_5c = fMinCut;
  iVar7 = Gia_ManVerifyCex(p_00,pCex,0);
  if (iVar7 == 0) {
    Abc_Print((int)pGVar8,"Gia_ManGlaRefine(): The initial counter-example is invalid.\n");
  }
  pGVar8 = p;
  Gia_ManGlaCollect(p,p->vGateClasses,&local_68,&local_48,(Vec_Int_t **)0x0,(Vec_Int_t **)0x0);
  if (local_48->nSize + local_68->nSize != p_00->vCis->nSize - p_00->nRegs) {
    __assert_fail("Vec_IntSize(vPis) + Vec_IntSize(vPPis) == Gia_ManPiNum(pAbs)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absOut.c"
                  ,0x7f,"int Gia_ManGlaRefine(Gia_Man_t *, Abc_Cex_t *, int, int)");
  }
  *(ulong *)p_00->pObjs = *(ulong *)p_00->pObjs & 0xbfffffffbfffffff | 0x40000000;
  if (pCex->iFrame < 0) {
    pVVar11 = p_00->vCos;
  }
  else {
    iVar7 = 0;
    do {
      iVar10 = p_00->nRegs;
      pVVar11 = p_00->vCis;
      iVar18 = pVVar11->nSize;
      local_50 = pCex;
      if (iVar10 < iVar18) {
        lVar13 = 0;
        do {
          if (iVar18 <= lVar13) goto LAB_005999c0;
          iVar18 = pVVar11->pArray[lVar13];
          if (((long)iVar18 < 0) || (p_00->nObjs <= iVar18)) goto LAB_005999a1;
          pGVar8 = (Gia_Man_t *)p_00->pObjs;
          if (pGVar8 == (Gia_Man_t *)0x0) break;
          puVar1 = (ulong *)((long)&pGVar8->pName + (long)iVar18 * 0xc);
          if (lVar13 < local_68->nSize) {
            uVar15 = pCex->nPis * iVar7 + pCex->nRegs + (int)lVar13;
            if (((uint)(&pCex[1].iPo)[(int)uVar15 >> 5] >> (uVar15 & 0x1f) & 1) == 0) {
              uVar19 = *puVar1 & 0xbfffffffbfffffff | 0x40000000;
            }
            else {
              uVar19 = *puVar1 & 0xbfffffffbfffffff | 0x4000000000000000;
            }
          }
          else {
            uVar19 = *puVar1 | 0x4000000040000000;
          }
          *puVar1 = uVar19;
          lVar13 = lVar13 + 1;
          iVar10 = p_00->nRegs;
          pVVar11 = p_00->vCis;
          iVar18 = pVVar11->nSize;
          pGVar8 = (Gia_Man_t *)(long)(iVar18 - iVar10);
        } while (lVar13 < (long)pGVar8);
      }
      if (0 < iVar10) {
        iVar18 = 0;
        do {
          iVar2 = p_00->vCis->nSize;
          uVar15 = iVar18 + (iVar2 - iVar10);
          if (((int)uVar15 < 0) || (iVar2 <= (int)uVar15)) goto LAB_005999c0;
          pGVar8 = (Gia_Man_t *)(ulong)uVar15;
          iVar3 = p_00->vCis->pArray[(long)pGVar8];
          lVar13 = (long)iVar3;
          if ((lVar13 < 0) || (p_00->nObjs <= iVar3)) goto LAB_005999a1;
          pGVar4 = p_00->pObjs;
          if (pGVar4 == (Gia_Obj_t *)0x0) break;
          pGVar8 = (Gia_Man_t *)(lVar13 * 3);
          pGVar20 = pGVar4 + lVar13;
          uVar19 = *(ulong *)pGVar20;
          if (iVar7 == 0) {
            pGVar22 = (Gia_Man_t *)(uVar19 & 0xbfffffffbfffffff | 0x40000000);
          }
          else {
            if (((~(uint)uVar19 & 0x9fffffff) != 0) ||
               (uVar15 = (uint)(uVar19 >> 0x20) & 0x1fffffff, (int)uVar15 < iVar2 - iVar10)) {
              __assert_fail("Gia_ObjIsRo(p, pObj)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                            ,0x1db,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
            }
            iVar10 = p_00->vCos->nSize;
            uVar15 = (iVar10 - iVar2) + uVar15;
            if (((int)uVar15 < 0) || (iVar10 <= (int)uVar15)) goto LAB_005999c0;
            uVar15 = p_00->vCos->pArray[uVar15];
            lVar13 = (long)(int)uVar15;
            if ((lVar13 < 0) || ((uint)p_00->nObjs <= uVar15)) goto LAB_005999a1;
            if ((*(ulong *)(pGVar4 + lVar13) & 0x4000000040000000) == 0) {
              __assert_fail("!Gia_ObjTerSimGetC( pTemp )",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                            ,0x356,"void Gia_ObjTerSimRo(Gia_Man_t *, Gia_Obj_t *)");
            }
            uVar12 = *(ulong *)(pGVar4 + lVar13) & 0x40000000;
            *(ulong *)pGVar20 = uVar19 & 0xffffffffbfffffff | uVar12;
            pGVar8 = (Gia_Man_t *)
                     (uVar19 & 0xbfffffffbfffffff | uVar12 |
                     *(ulong *)(pGVar4 + lVar13) & 0x4000000000000000);
            pGVar22 = pGVar8;
          }
          *(Gia_Man_t **)pGVar20 = pGVar22;
          iVar18 = iVar18 + 1;
          iVar10 = p_00->nRegs;
        } while (iVar18 < iVar10);
      }
      iVar10 = p_00->nObjs;
      if (0 < iVar10) {
        lVar13 = 0;
        lVar21 = 0;
        do {
          pGVar4 = p_00->pObjs;
          if (pGVar4 == (Gia_Obj_t *)0x0) break;
          uVar19 = *(ulong *)(&pGVar4->field_0x0 + lVar13);
          uVar15 = (uint)uVar19;
          if ((uVar19 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar15) {
            uVar12 = *(ulong *)((long)pGVar4 +
                               lVar13 + (ulong)(uint)((int)(uVar19 & 0x1fffffff) << 2) * -3) &
                     0x4000000040000000;
            if (uVar12 == 0) {
              __assert_fail("!Gia_ObjTerSimGetC( Gia_ObjFanin0(pObj) )",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                            ,0x33e,"void Gia_ObjTerSimAnd(Gia_Obj_t *)");
            }
            uVar14 = *(ulong *)((long)pGVar4 +
                               lVar13 + (ulong)((uint)(uVar19 >> 0x1e) & 0x7ffffffc) * -3) &
                     0x4000000040000000;
            if (uVar14 == 0) {
              __assert_fail("!Gia_ObjTerSimGetC( Gia_ObjFanin1(pObj) )",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                            ,0x33f,"void Gia_ObjTerSimAnd(Gia_Obj_t *)");
            }
            uVar16 = 0x4000000000000000;
            uVar17 = 0x40000000;
            if ((uVar15 >> 0x1d & 1) == 0) {
              uVar16 = 0x40000000;
            }
            if (uVar12 == uVar16) {
LAB_005995f0:
              uVar19 = uVar19 & 0xbfffffff3fffffff | 0x40000000;
            }
            else {
              uVar16 = 0x4000000000000000;
              if ((uVar19 >> 0x3d & 1) == 0) {
                uVar16 = 0x40000000;
              }
              if (uVar14 == uVar16) goto LAB_005995f0;
              if ((uVar15 >> 0x1d & 1) == 0) {
                uVar17 = 0x4000000000000000;
              }
              uVar16 = 0x40000000;
              if ((uVar19 >> 0x3d & 1) == 0) {
                uVar16 = 0x4000000000000000;
              }
              if ((uVar12 == uVar17) && (uVar14 == uVar16)) {
                uVar19 = uVar19 & 0xbfffffff3fffffff | 0x4000000000000000;
              }
              else {
                uVar19 = uVar19 | 0x4000000040000000;
              }
            }
            *(ulong *)(&pGVar4->field_0x0 + lVar13) = uVar19;
            iVar10 = p_00->nObjs;
          }
          lVar21 = lVar21 + 1;
          pGVar8 = (Gia_Man_t *)(long)iVar10;
          lVar13 = lVar13 + 0xc;
        } while (lVar21 < (long)pGVar8);
      }
      pVVar11 = p_00->vCos;
      if (0 < pVVar11->nSize) {
        lVar13 = 0;
        do {
          iVar10 = pVVar11->pArray[lVar13];
          if (((long)iVar10 < 0) || (p_00->nObjs <= iVar10)) goto LAB_005999a1;
          pGVar8 = (Gia_Man_t *)p_00->pObjs;
          if (pGVar8 == (Gia_Man_t *)0x0) break;
          puVar1 = (ulong *)((long)&pGVar8->pName + (long)iVar10 * 0xc);
          uVar19 = *puVar1;
          uVar15 = (uint)uVar19;
          if ((-1 < (int)uVar15) || ((uVar15 & 0x1fffffff) == 0x1fffffff)) {
            __assert_fail("Gia_ObjIsCo(pObj)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x349,"void Gia_ObjTerSimCo(Gia_Obj_t *)");
          }
          uVar12 = *(ulong *)((long)puVar1 + (ulong)(uVar15 & 0x1fffffff) * -0xc) &
                   0x4000000040000000;
          if (uVar12 == 0) {
            __assert_fail("!Gia_ObjTerSimGetC( Gia_ObjFanin0(pObj) )",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x34a,"void Gia_ObjTerSimCo(Gia_Obj_t *)");
          }
          if (((uVar15 >> 0x1d & 1) == 0) || (uVar12 != 0x4000000000000000)) {
            if (uVar12 == 0x4000000000000000) {
              if ((uVar15 >> 0x1d & 1) != 0) goto LAB_00599701;
LAB_005996f9:
              uVar19 = uVar19 & 0xbfffffffbfffffff | 0x4000000000000000;
            }
            else {
              if (uVar12 == 0x40000000) {
                if ((uVar15 >> 0x1d & 1) != 0) goto LAB_005996f9;
                goto LAB_005996cf;
              }
LAB_00599701:
              uVar19 = uVar19 | 0x4000000040000000;
            }
          }
          else {
LAB_005996cf:
            uVar19 = uVar19 & 0xbfffffffbfffffff | 0x40000000;
          }
          *puVar1 = uVar19;
          lVar13 = lVar13 + 1;
          pVVar11 = p_00->vCos;
        } while (lVar13 < pVVar11->nSize);
      }
      bVar23 = iVar7 < pCex->iFrame;
      iVar7 = iVar7 + 1;
    } while (bVar23);
  }
  if (pVVar11->nSize <= p_00->nRegs) {
    __assert_fail("v < Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x1b3,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
  }
  if (pVVar11->nSize < 1) {
LAB_005999c0:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar7 = *pVVar11->pArray;
  if (((long)iVar7 < 0) || (p_00->nObjs <= iVar7)) {
LAB_005999a1:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  if (((undefined1  [12])p_00->pObjs[iVar7] & (undefined1  [12])0x4000000040000000) ==
      (undefined1  [12])0x4000000000000000) {
    pGVar8 = p;
    pAVar9 = Gia_ManCexRemap(p,pCex,local_68);
    bVar23 = false;
    Abc_Print((int)pGVar8,"Procedure &gla_refine found a real counter-example in frame %d.\n",
              (ulong)(uint)pAVar9->iFrame);
    if (p_00->nObjs < 1) goto LAB_00599917;
  }
  else {
    pAVar9 = (Abc_Cex_t *)0x0;
  }
  lVar13 = 0;
  lVar21 = 0;
  do {
    if (p_00->pObjs == (Gia_Obj_t *)0x0) break;
    puVar1 = (ulong *)(&p_00->pObjs->field_0x0 + lVar13);
    *puVar1 = *puVar1 & 0xbfffffffbfffffff;
    lVar21 = lVar21 + 1;
    lVar13 = lVar13 + 0xc;
  } while (lVar21 < p_00->nObjs);
  bVar23 = pAVar9 == (Abc_Cex_t *)0x0;
  if (bVar23) {
    if (0 < local_48->nSize) {
      piVar5 = local_48->pArray;
      pVVar11 = p->vGateClasses;
      pGVar8 = (Gia_Man_t *)0x0;
      do {
        lVar13 = (long)piVar5[(long)pGVar8];
        if ((lVar13 < 0) || (pVVar11->nSize <= piVar5[(long)pGVar8])) goto LAB_005999c0;
        piVar6 = pVVar11->pArray;
        if (piVar6[lVar13] != 0) {
          __assert_fail("Vec_IntEntry( p->vGateClasses, iObjId ) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absOut.c"
                        ,0xac,"int Gia_ManGlaRefine(Gia_Man_t *, Abc_Cex_t *, int, int)");
        }
        piVar6[lVar13] = 1;
        pGVar8 = (Gia_Man_t *)((long)&pGVar8->pName + 1);
      } while ((long)pGVar8 < (long)local_48->nSize);
    }
    if (fVerbose != 0) {
      Abc_Print((int)pGVar8,"Additional objects = %d.  ");
      iVar10 = 3;
      iVar7 = clock_gettime(3,&local_40);
      if (iVar7 < 0) {
        lVar13 = -1;
      }
      else {
        lVar13 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
      }
      lVar13 = lVar13 + local_58;
      Abc_Print(iVar10,"%s =","Time");
      Abc_Print(iVar10,"%9.2f sec\n",(double)lVar13 / 1000000.0);
    }
  }
  else {
    bVar23 = false;
  }
LAB_00599917:
  if (local_68->pArray != (int *)0x0) {
    free(local_68->pArray);
  }
  free(local_68);
  if (local_48->pArray != (int *)0x0) {
    free(local_48->pArray);
  }
  free(local_48);
  Gia_ManStop(p_00);
  if (!bVar23) {
    if (p->pCexSeq != (Abc_Cex_t *)0x0) {
      free(p->pCexSeq);
    }
    p->pCexSeq = pAVar9;
    return 0;
  }
  if (local_5c != 0) {
    Nwk_ManDeriveMinCut(p,fVerbose);
    return -1;
  }
  return -1;
}

Assistant:

int Gia_ManGlaRefine( Gia_Man_t * p, Abc_Cex_t * pCex, int fMinCut, int fVerbose )
{
    extern void Nwk_ManDeriveMinCut( Gia_Man_t * p, int fVerbose );
    int fAddOneLayer = 1;
    Abc_Cex_t * pCexNew = NULL;
    Gia_Man_t * pAbs;
    Aig_Man_t * pAig;
    Abc_Cex_t * pCare;
    Vec_Int_t * vPis, * vPPis;
    int f, i, iObjId;
    abctime clk = Abc_Clock();
    int nOnes = 0, Counter = 0;
    if ( p->vGateClasses == NULL )
    {
        Abc_Print( 1, "Gia_ManGlaRefine(): Abstraction gate map is missing.\n" );
        return -1;
    }
    // derive abstraction
    pAbs = Gia_ManDupAbsGates( p, p->vGateClasses );
    Gia_ManStop( pAbs );
    pAbs = Gia_ManDupAbsGates( p, p->vGateClasses );
    if ( Gia_ManPiNum(pAbs) != pCex->nPis )
    {
        Abc_Print( 1, "Gia_ManGlaRefine(): The PI counts in GLA and in CEX do not match.\n" );
        Gia_ManStop( pAbs );
        return -1;
    }
    if ( !Gia_ManVerifyCex( pAbs, pCex, 0 ) )
    {
        Abc_Print( 1, "Gia_ManGlaRefine(): The initial counter-example is invalid.\n" );
//        Gia_ManStop( pAbs );
//        return -1;
    }
//    else
//        Abc_Print( 1, "Gia_ManGlaRefine(): The initial counter-example is correct.\n" );
    // get inputs
    Gia_ManGlaCollect( p, p->vGateClasses, &vPis, &vPPis, NULL, NULL );
    assert( Vec_IntSize(vPis) + Vec_IntSize(vPPis) == Gia_ManPiNum(pAbs) );
    // add missing logic
    if ( fAddOneLayer )
    {
        Gia_Obj_t * pObj;
        // check if this is a real counter-example
        Gia_ObjTerSimSet0( Gia_ManConst0(pAbs) );
        for ( f = 0; f <= pCex->iFrame; f++ )
        {
            Gia_ManForEachPi( pAbs, pObj, i )
            {
                if ( i >= Vec_IntSize(vPis) ) // PPIs
                    Gia_ObjTerSimSetX( pObj );
                else if ( Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i) )
                    Gia_ObjTerSimSet1( pObj );
                else
                    Gia_ObjTerSimSet0( pObj );
            }
            Gia_ManForEachRo( pAbs, pObj, i )
            {
                if ( f == 0 )
                    Gia_ObjTerSimSet0( pObj );
                else
                    Gia_ObjTerSimRo( pAbs, pObj );
            }
            Gia_ManForEachAnd( pAbs, pObj, i )
                Gia_ObjTerSimAnd( pObj );
            Gia_ManForEachCo( pAbs, pObj, i )
                Gia_ObjTerSimCo( pObj );
        }
        pObj = Gia_ManPo( pAbs, 0 );
        if ( Gia_ObjTerSimGet1(pObj) )
        {
            pCexNew = Gia_ManCexRemap( p, pCex, vPis );
            Abc_Print( 1, "Procedure &gla_refine found a real counter-example in frame %d.\n", pCexNew->iFrame );
        }
//        else
//            Abc_Print( 1, "CEX is not real.\n" );
        Gia_ManForEachObj( pAbs, pObj, i )
            Gia_ObjTerSimSetC( pObj );
        if ( pCexNew == NULL )
        {
            // grow one layer
            Vec_IntForEachEntry( vPPis, iObjId, i )
            {
                assert( Vec_IntEntry( p->vGateClasses, iObjId ) == 0 );
                Vec_IntWriteEntry( p->vGateClasses, iObjId, 1 );
            }
            if ( fVerbose )
            {
                Abc_Print( 1, "Additional objects = %d.  ", Vec_IntSize(vPPis) );
                Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            }
        }
    }
    else
    {
        // minimize the CEX
        pAig = Gia_ManToAigSimple( pAbs );
        pCare = Saig_ManCbaFindCexCareBits( pAig, pCex, Vec_IntSize(vPis), fVerbose );
        Aig_ManStop( pAig );
        if ( pCare == NULL )
            Abc_Print( 1, "Counter-example minimization has failed.\n" );
        // add new objects to the map
        iObjId = -1;
        for ( f = 0; f <= pCare->iFrame; f++ )
            for ( i = 0; i < pCare->nPis; i++ )
                if ( Abc_InfoHasBit( pCare->pData, pCare->nRegs + f * pCare->nPis + i ) )
                {
                    nOnes++;
                    assert( i >= Vec_IntSize(vPis) );
                    iObjId = Vec_IntEntry( vPPis, i - Vec_IntSize(vPis) );
                    assert( iObjId > 0 && iObjId < Gia_ManObjNum(p) );
                    if ( Vec_IntEntry( p->vGateClasses, iObjId ) > 0 )
                        continue;
                    assert( Vec_IntEntry( p->vGateClasses, iObjId ) == 0 );
                    Vec_IntWriteEntry( p->vGateClasses, iObjId, 1 );
    //                Abc_Print( 1, "Adding object %d.\n", iObjId );
    //                Gia_ObjPrint( p, Gia_ManObj(p, iObjId) );
                    Counter++;
                }
        Abc_CexFree( pCare );
        if ( fVerbose )
        {
            Abc_Print( 1, "Essential bits = %d.  Additional objects = %d.  ", nOnes, Counter );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        }
        // consider the case of SAT
        if ( iObjId == -1 )
        {
            pCexNew = Gia_ManCexRemap( p, pCex, vPis );
            Abc_Print( 1, "Procedure &gla_refine found a real counter-example in frame %d.\n", pCexNew->iFrame );
        }
    }
    Vec_IntFree( vPis );
    Vec_IntFree( vPPis );
    Gia_ManStop( pAbs );
    if ( pCexNew )
    {
        ABC_FREE( p->pCexSeq );
        p->pCexSeq = pCexNew;
        return 0;
    }
    // extract abstraction to include min-cut
    if ( fMinCut )
        Nwk_ManDeriveMinCut( p, fVerbose );
    return -1;
}